

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O2

void nn_connect_socket(nn_options_t *options,int sock)

{
  uint uVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < (options->bind_addresses).num; lVar2 = lVar2 + 1) {
    uVar1 = nn_bind(sock,(options->bind_addresses).items[lVar2]);
    nn_assert_errno(~uVar1 >> 0x1f,"Can\'t bind");
  }
  for (lVar2 = 0; lVar2 < (options->connect_addresses).num; lVar2 = lVar2 + 1) {
    uVar1 = nn_connect(sock,(options->connect_addresses).items[lVar2]);
    nn_assert_errno(~uVar1 >> 0x1f,"Can\'t connect");
  }
  return;
}

Assistant:

void nn_connect_socket (nn_options_t *options, int sock)
{
    int i;
    int rc;

    for (i = 0; i < options->bind_addresses.num; ++i) {
        rc = nn_bind (sock, options->bind_addresses.items[i]);
        nn_assert_errno (rc >= 0, "Can't bind");
    }
    for (i = 0; i < options->connect_addresses.num; ++i) {
        rc = nn_connect (sock, options->connect_addresses.items[i]);
        nn_assert_errno (rc >= 0, "Can't connect");
    }
}